

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int archive_compressor_xz_open(archive_write_filter *f)

{
  char cVar1;
  int iVar2;
  archive_write_filter *paVar3;
  archive *paVar4;
  undefined4 uVar5;
  long in_RDI;
  option_value *val;
  size_t bpb;
  size_t bs;
  int ret;
  private_data_conflict6 *data;
  archive_write_filter *in_stack_ffffffffffffffc8;
  archive_write_filter *paVar6;
  archive_write_filter *paVar7;
  undefined4 in_stack_ffffffffffffffe0;
  archive_write_filter *f_00;
  int local_4;
  
  f_00 = *(archive_write_filter **)(in_RDI + 0x40);
  local_4 = __archive_write_open_filter(in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    if (f_00[3].archive == (archive *)0x0) {
      paVar6 = (archive_write_filter *)0x10000;
      paVar7 = paVar6;
      if (**(int **)(in_RDI + 8) == -0x4f3a3f22) {
        iVar2 = archive_write_get_bytes_per_block((archive *)0x10000);
        paVar3 = (archive_write_filter *)(long)iVar2;
        paVar7 = paVar3;
        if ((paVar3 <= paVar6) && (paVar7 = paVar6, paVar3 != (archive_write_filter *)0x0)) {
          paVar7 = (archive_write_filter *)((long)paVar6 - (ulong)paVar6 % (ulong)paVar3);
        }
      }
      f_00[3].next_filter = paVar7;
      paVar4 = (archive *)malloc((size_t)f_00[3].next_filter);
      f_00[3].archive = paVar4;
      if (f_00[3].archive == (archive *)0x0) {
        archive_set_error(*(archive **)(in_RDI + 8),0xc,
                          "Can\'t allocate data for compression buffer");
        return -0x1e;
      }
    }
    *(code **)(in_RDI + 0x28) = archive_compressor_xz_write;
    if (*(int *)(in_RDI + 0x50) == 9) {
      iVar2 = (int)f_00->bytes_written;
      f_00[1].code = option_values[iVar2].dict_size;
      *(undefined8 *)&f_00[1].bytes_in_last_block = 0;
      *(undefined4 *)&f_00[2].bytes_written = 0;
      *(undefined4 *)((long)&f_00[2].bytes_written + 4) = 3;
      *(undefined4 *)&f_00[2].archive = 0;
      *(undefined4 *)((long)&f_00[2].archive + 4) = 2;
      uVar5 = 2;
      if ((int)f_00->bytes_written < 3) {
        uVar5 = 1;
      }
      *(undefined4 *)&f_00[2].next_filter = uVar5;
      *(uint32_t *)((long)&f_00[2].next_filter + 4) = option_values[iVar2].nice_len;
      *(lzma_match_finder *)&f_00[2].options = option_values[iVar2].mf;
      *(undefined4 *)((long)&f_00[2].options + 4) = 0;
      f_00[1].close = (_func_int_archive_write_filter_ptr *)0x4000000000000001;
      f_00[1].free = (_func_int_archive_write_filter_ptr *)&f_00[1].code;
      f_00[1].data = (void *)0xffffffffffffffff;
    }
    else {
      cVar1 = lzma_lzma_preset(&f_00[1].code,(int)f_00->bytes_written);
      if (cVar1 != '\0') {
        archive_set_error(*(archive **)(in_RDI + 8),-1,
                          "Internal error initializing compression library");
      }
      f_00[1].close = (_func_int_archive_write_filter_ptr *)0x21;
      f_00[1].free = (_func_int_archive_write_filter_ptr *)&f_00[1].code;
      f_00[1].data = (void *)0xffffffffffffffff;
    }
    iVar2 = archive_compressor_xz_init_stream
                      (f_00,(private_data_conflict6 *)CONCAT44(local_4,in_stack_ffffffffffffffe0));
    if (iVar2 == 0) {
      *(archive_write_filter **)(in_RDI + 0x40) = f_00;
      local_4 = 0;
    }
    else {
      local_4 = -0x1e;
    }
  }
  return local_4;
}

Assistant:

static int
archive_compressor_xz_open(struct archive_write_filter *f)
{
	struct private_data *data = f->data;
	int ret;

	ret = __archive_write_open_filter(f->next_filter);
	if (ret != ARCHIVE_OK)
		return (ret);

	if (data->compressed == NULL) {
		size_t bs = 65536, bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of the of bytes
			 * per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->compressed_buffer_size = bs;
		data->compressed
		    = (unsigned char *)malloc(data->compressed_buffer_size);
		if (data->compressed == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	f->write = archive_compressor_xz_write;

	/* Initialize compression library. */
	if (f->code == ARCHIVE_FILTER_LZIP) {
		const struct option_value *val =
		    &option_values[data->compression_level];

		data->lzma_opt.dict_size = val->dict_size;
		data->lzma_opt.preset_dict = NULL;
		data->lzma_opt.preset_dict_size = 0;
		data->lzma_opt.lc = LZMA_LC_DEFAULT;
		data->lzma_opt.lp = LZMA_LP_DEFAULT;
		data->lzma_opt.pb = LZMA_PB_DEFAULT;
		data->lzma_opt.mode =
		    data->compression_level<= 2? LZMA_MODE_FAST:LZMA_MODE_NORMAL;
		data->lzma_opt.nice_len = val->nice_len;
		data->lzma_opt.mf = val->mf;
		data->lzma_opt.depth = 0;
		data->lzmafilters[0].id = LZMA_FILTER_LZMA1;
		data->lzmafilters[0].options = &data->lzma_opt;
		data->lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */
	} else {
		if (lzma_lzma_preset(&data->lzma_opt, data->compression_level)) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "Internal error initializing compression library");
		}
		data->lzmafilters[0].id = LZMA_FILTER_LZMA2;
		data->lzmafilters[0].options = &data->lzma_opt;
		data->lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */
	}
	ret = archive_compressor_xz_init_stream(f, data);
	if (ret == LZMA_OK) {
		f->data = data;
		return (0);
	}
	return (ARCHIVE_FATAL);
}